

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

stumpless_target * stumpless_open_buffer_target(char *name,char *buffer,size_t size)

{
  stumpless_target *target;
  buffer_target *pbVar1;
  char *message;
  
  if (name == (char *)0x0) {
    message = "name was NULL";
  }
  else {
    if (buffer != (char *)0x0) {
      target = new_target(STUMPLESS_BUFFER_TARGET,name);
      if (target == (stumpless_target *)0x0) {
        return (stumpless_target *)0x0;
      }
      pbVar1 = new_buffer_target(buffer,size);
      target->id = pbVar1;
      if (pbVar1 == (buffer_target *)0x0) {
        destroy_target(target);
        return (stumpless_target *)0x0;
      }
      stumpless_set_current_target(target);
      return target;
    }
    message = "buffer was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_buffer_target( const char *name,
                              char *buffer,
                              size_t size ) {
  struct stumpless_target *target;

  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( buffer );

  target = new_target( STUMPLESS_BUFFER_TARGET, name );

  if( !target ) {
    goto fail;
  }

  target->id = new_buffer_target( buffer, size );
  if( !target->id ) {
    goto fail_id;
  }

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}